

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initCStream(ZSTD_CStream *zcs,int compressionLevel)

{
  uint uVar1;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  ZSTD_CCtx *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  local_8 = (ZSTD_CCtx *)ZSTD_CCtx_reset(in_stack_ffffffffffffffc8,0);
  uVar1 = ERR_isError((size_t)local_8);
  if (uVar1 == 0) {
    local_8 = (ZSTD_CCtx *)ZSTD_CCtx_refCDict(in_stack_ffffffffffffffc8,(ZSTD_CDict *)0x23e1ae);
    uVar1 = ERR_isError((size_t)local_8);
    if (uVar1 == 0) {
      local_8 = (ZSTD_CCtx *)
                ZSTD_CCtx_setParameter
                          (local_8,(ZSTD_cParameter)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                           (int)in_stack_ffffffffffffffd0);
      uVar1 = ERR_isError((size_t)local_8);
      if (uVar1 == 0) {
        local_8 = (ZSTD_CCtx *)0x0;
      }
    }
  }
  return (size_t)local_8;
}

Assistant:

size_t ZSTD_initCStream(ZSTD_CStream* zcs, int compressionLevel)
{
    DEBUGLOG(4, "ZSTD_initCStream");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, NULL) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setParameter(zcs, ZSTD_c_compressionLevel, compressionLevel) , "");
    return 0;
}